

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong idx;
  idx_t idx_00;
  uhugeint_t uVar9;
  uhugeint_t left;
  uhugeint_t left_00;
  uhugeint_t right;
  uhugeint_t right_00;
  uhugeint_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      idx_00 = 0;
      do {
        uVar9.upper = *(uint64_t *)((long)&ldata->lower + lVar5);
        uVar9.lower = *(uint64_t *)((long)ldata + lVar5 + -8);
        right_01.upper = *(uint64_t *)((long)&rdata->lower + lVar5);
        right_01.lower = *(uint64_t *)((long)rdata + lVar5 + -8);
        uVar9 = BinaryZeroIsNullWrapper::
                Operation<bool,duckdb::ModuloOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                          (fun,uVar9,right_01,mask,idx_00);
        *(uint64_t *)((long)result_data + lVar5 + -8) = uVar9.lower;
        *(uint64_t *)((long)&result_data->lower + lVar5) = uVar9.upper;
        idx_00 = idx_00 + 1;
        lVar5 = lVar5 + 0x10;
      } while (count != idx_00);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    idx = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = idx + 0x40;
        if (count <= idx + 0x40) {
          uVar7 = count;
        }
LAB_010dd0ff:
        uVar8 = idx;
        if (idx < uVar7) {
          uVar4 = idx << 4 | 8;
          do {
            left_00.upper = *(uint64_t *)((long)&ldata->lower + uVar4);
            left_00.lower = *(uint64_t *)((long)ldata + (uVar4 - 8));
            right_00.upper = *(uint64_t *)((long)&rdata->lower + uVar4);
            right_00.lower = *(uint64_t *)((long)rdata + (uVar4 - 8));
            uVar9 = BinaryZeroIsNullWrapper::
                    Operation<bool,duckdb::ModuloOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                              (fun,left_00,right_00,mask,idx);
            *(uint64_t *)((long)result_data + (uVar4 - 8)) = uVar9.lower;
            *(uint64_t *)((long)&result_data->lower + uVar4) = uVar9.upper;
            idx = idx + 1;
            uVar4 = uVar4 + 0x10;
            uVar8 = uVar7;
          } while (uVar7 != idx);
        }
      }
      else {
        uVar4 = puVar1[uVar2];
        uVar7 = idx + 0x40;
        if (count <= idx + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_010dd0ff;
          uVar8 = idx;
          if (idx < uVar7) {
            uVar6 = idx << 4 | 8;
            uVar3 = 0;
            do {
              if ((uVar4 >> (uVar3 & 0x3f) & 1) != 0) {
                left.upper = *(uint64_t *)((long)&ldata->lower + uVar6);
                left.lower = *(uint64_t *)((long)ldata + (uVar6 - 8));
                right.upper = *(uint64_t *)((long)&rdata->lower + uVar6);
                right.lower = *(uint64_t *)((long)rdata + (uVar6 - 8));
                uVar9 = BinaryZeroIsNullWrapper::
                        Operation<bool,duckdb::ModuloOperator,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                  (fun,left,right,mask,idx + uVar3);
                *(uint64_t *)((long)result_data + (uVar6 - 8)) = uVar9.lower;
                *(uint64_t *)((long)&result_data->lower + uVar6) = uVar9.upper;
              }
              uVar3 = uVar3 + 1;
              uVar6 = uVar6 + 0x10;
              uVar8 = uVar7;
            } while (uVar7 - idx != uVar3);
          }
        }
      }
      uVar2 = uVar2 + 1;
      idx = uVar8;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}